

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

NullableValue<kj::Array<unsigned_char>_> * __thiscall
kj::_::NullableValue<kj::Array<unsigned_char>_>::operator=
          (NullableValue<kj::Array<unsigned_char>_> *this,
          NullableValue<kj::Array<unsigned_char>_> *other)

{
  Array<unsigned_char> *params;
  NullableValue<kj::Array<unsigned_char>_> *other_local;
  NullableValue<kj::Array<unsigned_char>_> *this_local;
  
  if (other != this) {
    if ((this->isSet & 1U) != 0) {
      this->isSet = false;
      dtor<kj::Array<unsigned_char>>(&(this->field_1).value);
    }
    if ((other->isSet & 1U) != 0) {
      params = mv<kj::Array<unsigned_char>>(&(other->field_1).value);
      ctor<kj::Array<unsigned_char>,kj::Array<unsigned_char>>(&(this->field_1).value,params);
      this->isSet = true;
    }
  }
  return this;
}

Assistant:

inline NullableValue& operator=(NullableValue&& other) {
    if (&other != this) {
      // Careful about throwing destructors/constructors here.
      if (isSet) {
        isSet = false;
        dtor(value);
      }
      if (other.isSet) {
        ctor(value, kj::mv(other.value));
        isSet = true;
      }
    }
    return *this;
  }